

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O1

void do_clast_scalar(DisasContext_conflict1 *s,int esz,int pg,int rm,_Bool before,TCGv_i64 reg_val)

{
  TCGContext_conflict1 *s_00;
  TCGTemp *pTVar1;
  TCGv_i64 v1;
  TCGv_i64 c2;
  undefined7 in_register_00000081;
  uintptr_t o_3;
  uintptr_t o;
  TCGv_i32 ret;
  uintptr_t o_1;
  uintptr_t o_2;
  TCGv_i64 ret_00;
  
  s_00 = s->uc->tcg_ctx;
  pTVar1 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I32,false);
  ret = (TCGv_i32)((long)pTVar1 - (long)s_00);
  find_last_active(s,ret,esz,pg);
  pTVar1 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I64,false);
  ret_00 = (TCGv_i64)((long)pTVar1 - (long)s_00);
  tcg_gen_ext_i32_i64_aarch64(s_00,ret_00,ret);
  if ((int)CONCAT71(in_register_00000081,before) == 0) {
    incr_last_active(s,ret,esz);
  }
  v1 = load_last_active(s,ret,rm,esz);
  tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(ret + (long)s_00));
  c2 = tcg_const_i64_aarch64(s_00,0);
  tcg_gen_movcond_i64_aarch64(s_00,TCG_COND_GE,reg_val,ret_00,c2,v1,reg_val);
  tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(c2 + (long)s_00));
  tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(ret_00 + (long)s_00));
  tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(v1 + (long)s_00));
  return;
}

Assistant:

static void do_clast_scalar(DisasContext *s, int esz, int pg, int rm,
                            bool before, TCGv_i64 reg_val)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 last = tcg_temp_new_i32(tcg_ctx);
    TCGv_i64 ele, cmp, zero;

    find_last_active(s, last, esz, pg);

    /* Extend the original value of last prior to incrementing.  */
    cmp = tcg_temp_new_i64(tcg_ctx);
    tcg_gen_ext_i32_i64(tcg_ctx, cmp, last);

    if (!before) {
        incr_last_active(s, last, esz);
    }

    /* The conceit here is that while last < 0 indicates not found, after
     * adjusting for cpu_env->vfp.zregs[rm], it is still a valid address
     * from which we can load garbage.  We then discard the garbage with
     * a conditional move.
     */
    ele = load_last_active(s, last, rm, esz);
    tcg_temp_free_i32(tcg_ctx, last);

    zero = tcg_const_i64(tcg_ctx, 0);
    tcg_gen_movcond_i64(tcg_ctx, TCG_COND_GE, reg_val, cmp, zero, ele, reg_val);

    tcg_temp_free_i64(tcg_ctx, zero);
    tcg_temp_free_i64(tcg_ctx, cmp);
    tcg_temp_free_i64(tcg_ctx, ele);
}